

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall KDIS::NETWORK::Connection::AddMulticastAddress(Connection *this,KString *A)

{
  char *__cp;
  KException *this_00;
  int *piVar1;
  KCHAR8 *__s;
  allocator<char> local_49;
  KString local_48;
  int local_24;
  in_addr_t local_20;
  KINT32 iRet;
  ip_mreq mc;
  KString *A_local;
  Connection *this_local;
  
  mc = (ip_mreq)A;
  __cp = (char *)std::__cxx11::string::c_str();
  local_20 = inet_addr(__cp);
  iRet = htonl(0);
  local_24 = setsockopt(this->m_iSocket[1],0,0x23,&local_20,8);
  if (local_24 == -1) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    piVar1 = __errno_location();
    __s = getErrorText(this,*piVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    KException::KException(this_00,&local_48,0xc);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  return;
}

Assistant:

void Connection::AddMulticastAddress(const KString &A) noexcept(false)
{
    // Attempt to join the group
    ip_mreq mc;
    mc.imr_multiaddr.s_addr = inet_addr( m_sSendAddress.c_str() );
    mc.imr_interface.s_addr = htonl( INADDR_ANY );
    KINT32 iRet = setsockopt( m_iSocket[RECEIVE_SOCK], IPPROTO_IP, IP_ADD_MEMBERSHIP, ( KOCTET* )&mc, sizeof( mc ) );
    if( iRet == SOCKET_ERROR )
    {
        THROW_ERROR;
    }
}